

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O3

void lqMapOverAllOutsideObjects
               (lqInternalDB *lq,float x,float y,float z,float radius,lqCallBackFunction func,
               void *clientQueryState)

{
  lqClientProxy *plVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  plVar1 = lq->other;
  if (plVar1 != (lqClientProxy *)0x0) {
    do {
      fVar4 = x - plVar1->x;
      fVar3 = y - plVar1->y;
      fVar2 = z - plVar1->z;
      fVar2 = fVar2 * fVar2 + fVar4 * fVar4 + fVar3 * fVar3;
      if (fVar2 < radius * radius) {
        (*func)(plVar1->object,fVar2,clientQueryState);
      }
      plVar1 = plVar1->next;
    } while (plVar1 != (lqClientProxy *)0x0);
  }
  return;
}

Assistant:

void lqMapOverAllOutsideObjects (lqInternalDB* lq, 
				 float x, float y, float z,
				 float radius,
				 lqCallBackFunction func,
				 void* clientQueryState)
{
    lqClientProxy* co = lq->other;
    float radiusSquared = radius * radius;

    /* traverse the "other" bin's client object list */
    lqTraverseBinClientObjectList (co,
				   radiusSquared,
				   func,
				   clientQueryState);
}